

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O2

ptr<buffer> __thiscall nuraft::custom_notification_msg::serialize(custom_notification_msg *this)

{
  size_t sVar1;
  byte *raw_ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint8_t *in_RSI;
  ptr<buffer> pVar3;
  buffer_serializer bs;
  
  if (*(buffer **)(in_RSI + 8) == (buffer *)0x0) {
    sVar1 = 6;
  }
  else {
    sVar1 = buffer::size(*(buffer **)(in_RSI + 8));
    sVar1 = sVar1 + 6;
  }
  buffer::alloc((buffer *)this,sVar1);
  buffer_serializer::buffer_serializer(&bs,(ptr<buffer> *)this,LITTLE);
  buffer_serializer::put_u8(&bs,'\0');
  buffer_serializer::put_u8(&bs,*in_RSI);
  if (*(buffer **)(in_RSI + 8) == (buffer *)0x0) {
    buffer_serializer::put_u32(&bs,0);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    raw_ptr = buffer::data_begin(*(buffer **)(in_RSI + 8));
    sVar1 = buffer::size(*(buffer **)(in_RSI + 8));
    buffer_serializer::put_bytes(&bs,raw_ptr,sVar1);
    _Var2._M_pi = extraout_RDX;
  }
  pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (ptr<buffer>)pVar3.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> custom_notification_msg::serialize() const {
    //   << Format >>
    // version          1 byte
    // type             1 byte
    // ctx length (X)   4 bytes
    // ctx              X bytes

    const uint8_t CURRENT_VERSION = 0x0;

    size_t len = sizeof(uint8_t) +
                 sizeof(uint8_t) +
                 sizeof(uint32_t) +
                 ( (ctx_) ? ctx_->size() : 0 );

    ptr<buffer> ret = buffer::alloc(len);
    buffer_serializer bs(ret);
    bs.put_u8(CURRENT_VERSION);
    bs.put_u8(type_);
    if (ctx_) {
        bs.put_bytes(ctx_->data_begin(), ctx_->size());
    } else {
        bs.put_u32(0);
    }

    return ret;
}